

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O0

UniValue * BIP22ValidationResult(BlockValidationState *state)

{
  bool bVar1;
  undefined8 uVar2;
  UniValue *in_RSI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  string strRejectReason;
  ValidationState<BlockValidationResult> *in_stack_ffffffffffffff48;
  ValidationState<BlockValidationResult> *in_stack_ffffffffffffff50;
  string *str;
  UniValue *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  UniValue *this_00;
  int in_stack_ffffffffffffff9c;
  string local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  this_00 = in_RDI;
  bVar1 = ValidationState<BlockValidationResult>::IsValid(in_stack_ffffffffffffff48);
  if (bVar1) {
    str = &local_28;
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    UniValue::UniValue(this,(VType)((ulong)in_RDI >> 0x20),str);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff48);
  }
  else {
    bVar1 = ValidationState<BlockValidationResult>::IsError(in_stack_ffffffffffffff48);
    if (bVar1) {
      uVar2 = __cxa_allocate_exception(0x58);
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                ((ValidationState<BlockValidationResult> *)in_RSI);
      JSONRPCError(in_stack_ffffffffffffff9c,(string *)in_RSI);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar2,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_00626407;
    }
    bVar1 = ValidationState<BlockValidationResult>::IsInvalid(in_stack_ffffffffffffff48);
    if (bVar1) {
      ValidationState<BlockValidationResult>::GetRejectReason_abi_cxx11_(in_stack_ffffffffffffff50);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffff48);
      if (bVar1) {
        UniValue::UniValue<const_char_(&)[9],_char[9],_true>(this_00,(char (*) [9])in_RSI);
      }
      else {
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (in_RSI,in_stack_ffffffffffffff80);
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff48);
    }
    else {
      UniValue::UniValue<const_char_(&)[7],_char[7],_true>(this_00,(char (*) [7])in_RSI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this;
  }
LAB_00626407:
  __stack_chk_fail();
}

Assistant:

static UniValue BIP22ValidationResult(const BlockValidationState& state)
{
    if (state.IsValid())
        return UniValue::VNULL;

    if (state.IsError())
        throw JSONRPCError(RPC_VERIFY_ERROR, state.ToString());
    if (state.IsInvalid())
    {
        std::string strRejectReason = state.GetRejectReason();
        if (strRejectReason.empty())
            return "rejected";
        return strRejectReason;
    }
    // Should be impossible
    return "valid?";
}